

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CasesSimp.cpp
# Opt level: O3

VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_> __thiscall
Inferences::CasesSimp::RewriteableSubtermsFn::operator()(RewriteableSubtermsFn *this,Literal *lit)

{
  long *plVar1;
  int *piVar2;
  long lVar3;
  int iVar4;
  BooleanSubtermIt *this_00;
  IteratorCore<Kernel::TermList> *pIVar5;
  ItemList *pIVar6;
  undefined8 *puVar7;
  Term *in_RDX;
  VirtualIterator<Kernel::TermList> local_38;
  VirtualIterator<Kernel::TermList> local_30;
  undefined8 local_28;
  long *local_20;
  
  this_00 = (BooleanSubtermIt *)::operator_new(0x38);
  Kernel::BooleanSubtermIt::BooleanSubtermIt(this_00,in_RDX,false);
  piVar2 = &(this_00->super_IteratorCore<Kernel::TermList>)._refCnt;
  *piVar2 = *piVar2 + 1;
  local_30._core = (IteratorCore<Kernel::TermList> *)this_00;
  iVar4 = (*(this_00->super_IteratorCore<Kernel::TermList>)._vptr_IteratorCore[2])(this_00);
  if ((char)iVar4 == '\0') {
    Lib::VirtualIterator<Kernel::TermList>::getEmpty();
  }
  else {
    pIVar5 = (IteratorCore<Kernel::TermList> *)::operator_new(0x20);
    pIVar5->_refCnt = 0;
    pIVar5->_vptr_IteratorCore = (_func_int **)&PTR__UniquePersistentIterator_00b379f0;
    pIVar6 = Lib::UniquePersistentIterator<Lib::VirtualIterator<Kernel::TermList>_>::
             getUniqueItemList(&local_30,(size_t *)&pIVar5[1]._refCnt);
    pIVar5[1]._vptr_IteratorCore = (_func_int **)pIVar6;
    pIVar5->_refCnt = pIVar5->_refCnt + 1;
    local_38._core = pIVar5;
  }
  Lib::pushPairIntoRightIterator<Kernel::Literal*,Lib::VirtualIterator<Kernel::TermList>>
            ((Lib *)&local_28,(Literal *)in_RDX,&local_38);
  puVar7 = (undefined8 *)
           Lib::FixedSizeAllocator<32UL>::alloc
                     ((FixedSizeAllocator<32UL> *)(Lib::GLOBAL_SMALL_OBJECT_ALLOCATOR + 0x48));
  if (local_20 == (long *)0x0) {
    *puVar7 = &PTR__ProxyIterator_00b37838;
    puVar7[2] = local_28;
    puVar7[3] = 0;
    *(undefined8 **)this = puVar7;
    *(undefined4 *)(puVar7 + 1) = 1;
  }
  else {
    lVar3 = local_20[1];
    *puVar7 = &PTR__ProxyIterator_00b37838;
    puVar7[2] = local_28;
    puVar7[3] = local_20;
    *(undefined8 **)this = puVar7;
    *(undefined4 *)(puVar7 + 1) = 1;
    iVar4 = (int)lVar3 + 1;
    *(int *)(local_20 + 1) = iVar4;
    if (iVar4 == 0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  if (local_20 != (long *)0x0) {
    plVar1 = local_20 + 1;
    *(int *)plVar1 = (int)*plVar1 + -1;
    if ((int)*plVar1 == 0) {
      (**(code **)(*local_20 + 8))();
    }
  }
  if (local_38._core != (IteratorCore<Kernel::TermList> *)0x0) {
    piVar2 = &(local_38._core)->_refCnt;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*(local_38._core)->_vptr_IteratorCore[1])();
    }
  }
  if ((BooleanSubtermIt *)local_30._core != (BooleanSubtermIt *)0x0) {
    piVar2 = &(local_30._core)->_refCnt;
    *piVar2 = *piVar2 + -1;
    if (*piVar2 == 0) {
      (*((IteratorCore<Kernel::TermList> *)&(local_30._core)->_vptr_IteratorCore)->
        _vptr_IteratorCore[1])();
    }
  }
  return (VirtualIterator<std::pair<Kernel::Literal_*,_Kernel::TermList>_>)
         (IteratorCore<std::pair<Kernel::Literal_*,_Kernel::TermList>_> *)this;
}

Assistant:

VirtualIterator<pair<Literal*, TermList> > operator()(Literal* lit)
  {
    return pvi( pushPairIntoRightIterator(lit, 
                getUniquePersistentIterator(vi(new BooleanSubtermIt(lit)))));
  }